

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log_test.c
# Opt level: O0

char * test_string_encode_decode(void)

{
  _Bool _Var1;
  int iVar2;
  size_t base64_len;
  double a;
  double b;
  hdr_histogram *local_30;
  hdr_histogram *hdr_new;
  hdr_histogram *histogram;
  char *data;
  char *pcStack_10;
  int i;
  
  local_30 = (hdr_histogram *)0x0;
  hdr_alloc(3600000000,3,&hdr_new);
  for (data._4_4_ = 1; data._4_4_ < 100; data._4_4_ = data._4_4_ + 1) {
    hdr_record_value(hdr_new,(long)(data._4_4_ * data._4_4_));
  }
  iVar2 = hdr_log_encode(hdr_new,(char **)&histogram);
  if (iVar2 == 0) {
    base64_len = strlen((char *)histogram);
    iVar2 = hdr_log_decode(&local_30,(char *)histogram,base64_len);
    if (iVar2 == 0) {
      _Var1 = compare_histogram(hdr_new,local_30);
      if (_Var1) {
        a = hdr_mean(hdr_new);
        b = hdr_mean(local_30);
        _Var1 = compare_double(a,b,0.001);
        if (_Var1) {
          pcStack_10 = (char *)0x0;
        }
        else {
          pcStack_10 = "Mean different after encode/decode";
        }
      }
      else {
        pcStack_10 = "Histograms should be the same";
      }
    }
    else {
      pcStack_10 = "Failed to decode histogram data";
    }
  }
  else {
    pcStack_10 = "Failed to encode histogram data";
  }
  return pcStack_10;
}

Assistant:

static char* test_string_encode_decode(void)
{
    int i;
    char *data;
    struct hdr_histogram *histogram, *hdr_new = NULL;

    hdr_alloc(INT64_C(3600) * 1000 * 1000, 3, &histogram);

    for (i = 1; i < 100; i++)
    {
        hdr_record_value(histogram, i*i);
    }

    mu_assert("Failed to encode histogram data", hdr_log_encode(histogram, &data) == 0);
    mu_assert("Failed to decode histogram data", hdr_log_decode(&hdr_new, data, strlen(data)) == 0);
    mu_assert("Histograms should be the same", compare_histogram(histogram, hdr_new));
    mu_assert("Mean different after encode/decode", compare_double(hdr_mean(histogram), hdr_mean(hdr_new), 0.001));

    return 0;
}